

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structs.c
# Opt level: O0

ulp_public_key * ulp_alloc_public_key(size_t n,size_t l)

{
  uint64_t *puVar1;
  size_t in_RSI;
  size_t in_RDI;
  ulp_public_key *key;
  ulp_public_key *local_8;
  
  local_8 = (ulp_public_key *)malloc(0x30);
  if (local_8 == (ulp_public_key *)0x0) {
    local_8 = (ulp_public_key *)0x0;
  }
  else {
    local_8->n = in_RDI;
    local_8->l = in_RSI;
    puVar1 = (uint64_t *)malloc(in_RDI * in_RDI * 8);
    local_8->A = puVar1;
    puVar1 = (uint64_t *)malloc(in_RSI * in_RDI * 8);
    local_8->P = puVar1;
    if ((local_8->A == (uint64_t *)0x0) || (local_8->P == (uint64_t *)0x0)) {
      free(local_8->A);
      free(local_8->P);
      free(local_8);
      local_8 = (ulp_public_key *)0x0;
    }
  }
  return local_8;
}

Assistant:

ulp_public_key* ulp_alloc_public_key(size_t n, size_t l) {
    ulp_public_key* key = malloc(sizeof(ulp_public_key));
    if(key == NULL)
        return NULL;
    key->n = n;
    key->l = l;
    key->A = malloc(n*n*sizeof(key->q));
    key->P = malloc(l*n*sizeof(key->q));
    if(key->A == NULL || key->P == NULL) {
        free(key->A);
        free(key->P);
        free(key);
        return NULL;
    }
    return key;
}